

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O0

int scv_shrink_to_fit(scv_vector *v)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  ulong local_28;
  size_t newcapacity;
  void *newdata;
  scv_vector *v_local;
  
  if (v == (scv_vector *)0x0) {
    __assert_fail("v != NULL","/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c"
                  ,0x108,"int scv_shrink_to_fit(struct scv_vector *)");
  }
  if (v->data == (void *)0x0) {
    __assert_fail("v->data != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x109,
                  "int scv_shrink_to_fit(struct scv_vector *)");
  }
  if (v->capacity == v->size) {
    v_local._4_4_ = 0;
  }
  else {
    local_28 = v->size;
    if (v->objsize == 0) {
      __assert_fail("v->objsize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x111,
                    "int scv_shrink_to_fit(struct scv_vector *)");
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = v->objsize;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) <= local_28) {
      __assert_fail("newcapacity < (size_t) -1 / v->objsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x112,
                    "int scv_shrink_to_fit(struct scv_vector *)");
    }
    if (local_28 * v->objsize < 0x40) {
      local_28 = (v->objsize + 0x3f) / v->objsize;
    }
    pvVar2 = realloc(v->data,local_28 * v->objsize);
    if (pvVar2 == (void *)0x0) {
      v_local._4_4_ = -2;
    }
    else {
      v->data = pvVar2;
      v->capacity = local_28;
      v_local._4_4_ = 0;
    }
  }
  return v_local._4_4_;
}

Assistant:

int scv_shrink_to_fit(struct scv_vector *v)
{
	void *newdata;
	size_t newcapacity;

	assert(v != NULL);
	assert(v->data != NULL);

	if (v->capacity == v->size) {
		return SCV_OK;
	}

	newcapacity = v->size;

	assert(v->objsize > 0);
	assert(newcapacity < (size_t) -1 / v->objsize);

	/* Minimum capacity is SCV_MIN_ALLOC bytes or 1 element */
	if (newcapacity * v->objsize < SCV_MIN_ALLOC) {
		newcapacity = (SCV_MIN_ALLOC + (v->objsize - 1)) / v->objsize;
	}

	newdata = realloc(v->data, newcapacity * v->objsize);

	if (newdata == NULL) {
		return SCV_ENOMEM;
	}

	v->data = newdata;
	v->capacity = newcapacity;

	return SCV_OK;
}